

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrEnumerateBoundSourcesForAction
                   (XrSession session,XrBoundSourcesForActionEnumerateInfo *enumerateInfo,
                   uint32_t sourceCapacityInput,uint32_t *sourceCountOutput,XrPath *sources)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_44;
  LoaderInstance *pLStack_40;
  XrResult result;
  LoaderInstance *loader_instance;
  XrPath *sources_local;
  uint32_t *sourceCountOutput_local;
  XrBoundSourcesForActionEnumerateInfo *pXStack_20;
  uint32_t sourceCapacityInput_local;
  XrBoundSourcesForActionEnumerateInfo *enumerateInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)sources;
  sources_local = (XrPath *)sourceCountOutput;
  sourceCountOutput_local._4_4_ = sourceCapacityInput;
  pXStack_20 = enumerateInfo;
  enumerateInfo_local = (XrBoundSourcesForActionEnumerateInfo *)session;
  local_44 = ActiveLoaderInstance::Get(&stack0xffffffffffffffc0,"xrEnumerateBoundSourcesForAction");
  if (XR_ERROR_VALIDATION_FAILURE < local_44) {
    this = LoaderInstance::DispatchTable(pLStack_40);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_44 = (*pXVar1->EnumerateBoundSourcesForAction)
                         ((XrSession)enumerateInfo_local,pXStack_20,sourceCountOutput_local._4_4_,
                          (uint32_t *)sources_local,(XrPath *)loader_instance);
  }
  return local_44;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateBoundSourcesForAction(
    XrSession                                   session,
    const XrBoundSourcesForActionEnumerateInfo* enumerateInfo,
    uint32_t                                    sourceCapacityInput,
    uint32_t*                                   sourceCountOutput,
    XrPath*                                     sources) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateBoundSourcesForAction");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateBoundSourcesForAction(session, enumerateInfo, sourceCapacityInput, sourceCountOutput, sources);
    }
    return result;
}